

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

vector<duckdb::LogicalType,_true> *
duckdb::AggregateFunctionExtractor::GetParameterLogicalTypes
          (vector<duckdb::LogicalType,_true> *__return_storage_ptr__,
          AggregateFunctionCatalogEntry *entry,idx_t offset)

{
  AggregateFunction fun;
  AggregateFunction AStack_138;
  
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            (&AStack_138,&(entry->functions).super_FunctionSet<duckdb::AggregateFunction>,offset);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&__return_storage_ptr__->
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &AStack_138.super_BaseScalarFunction.super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  AggregateFunction::~AggregateFunction(&AStack_138);
  return __return_storage_ptr__;
}

Assistant:

static vector<LogicalType> GetParameterLogicalTypes(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return fun.arguments;
	}